

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O0

ssize_t __thiscall
kj::ArrayOutputStream::write(ArrayOutputStream *this,int __fd,void *__buf,size_t __n)

{
  Fault FVar1;
  uchar *puVar2;
  uchar *puVar3;
  undefined4 in_register_00000034;
  Fault local_48;
  Fault f_1;
  long local_30;
  Fault local_28;
  Fault f;
  size_t size_local;
  void *src_local;
  ArrayOutputStream *this_local;
  
  f.exception = (Exception *)__buf;
  if (((byte *)CONCAT44(in_register_00000034,__fd) == this->fillPos) &&
     (puVar3 = this->fillPos, puVar2 = ArrayPtr<unsigned_char>::end(&this->array),
     FVar1.exception = f.exception, puVar3 != puVar2)) {
    puVar3 = ArrayPtr<unsigned_char>::end(&this->array);
    if (FVar1.exception <= (Exception *)(puVar3 + -(long)this->fillPos)) {
      this->fillPos = this->fillPos + (long)((f.exception)->trace + -10);
      return (ssize_t)this;
    }
    puVar3 = ArrayPtr<unsigned_char>::end(&this->array);
    local_30 = (long)puVar3 - (long)this->fillPos;
    _::Debug::Fault::Fault<kj::Exception::Type,unsigned_long&,unsigned_char*&,long>
              (&local_28,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
               ,0x114,FAILED,"size <= array.end() - fillPos","size, fillPos, array.end() - fillPos",
               (unsigned_long *)&f,&this->fillPos,&local_30);
    _::Debug::Fault::fatal(&local_28);
  }
  FVar1.exception = f.exception;
  puVar3 = ArrayPtr<unsigned_char>::end(&this->array);
  if (FVar1.exception <= (Exception *)(puVar3 + -(long)this->fillPos)) {
    memcpy(this->fillPos,(byte *)CONCAT44(in_register_00000034,__fd),(size_t)f.exception);
    this->fillPos = this->fillPos + (long)((f.exception)->trace + -10);
    return (ssize_t)this;
  }
  _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[77]>
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
             ,0x118,FAILED,"size <= (size_t)(array.end() - fillPos)",
             "\"ArrayOutputStream\'s backing array was not large enough for the data written.\"",
             (char (*) [77])
             "ArrayOutputStream\'s backing array was not large enough for the data written.");
  _::Debug::Fault::fatal(&local_48);
}

Assistant:

void ArrayOutputStream::write(const void* src, size_t size) {
  if (src == fillPos && fillPos != array.end()) {
    // Oh goody, the caller wrote directly into our buffer.
    KJ_REQUIRE(size <= array.end() - fillPos, size, fillPos, array.end() - fillPos);
    fillPos += size;
  } else {
    KJ_REQUIRE(size <= (size_t)(array.end() - fillPos),
            "ArrayOutputStream's backing array was not large enough for the data written.");
    memcpy(fillPos, src, size);
    fillPos += size;
  }
}